

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O2

int next_null(hd_context *ctx,hd_stream *stm,size_t max)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  size_t sVar7;
  size_t __n;
  
  plVar2 = (long *)stm->state;
  uVar6 = 0xffffffff;
  if (plVar2[1] != 0) {
    hd_seek(ctx,(hd_stream *)*plVar2,plVar2[2],0);
    sVar7 = hd_available(ctx,(hd_stream *)*plVar2,max);
    lVar3 = *plVar2;
    uVar4 = plVar2[1];
    if (uVar4 <= sVar7) {
      sVar7 = uVar4;
    }
    __n = 0x1000;
    if (sVar7 < 0x1000) {
      __n = sVar7;
    }
    memcpy(plVar2 + 3,*(void **)(lVar3 + 0x18),__n);
    stm->rp = (uchar *)(plVar2 + 3);
    stm->wp = (uchar *)((long)plVar2 + __n + 0x18);
    uVar6 = 0xffffffff;
    if (sVar7 != 0) {
      plVar1 = (long *)(lVar3 + 0x18);
      *plVar1 = *plVar1 + __n;
      plVar2[1] = uVar4 - __n;
      plVar2[2] = plVar2[2] + __n;
      stm->pos = stm->pos + (int)__n;
      pbVar5 = stm->rp;
      stm->rp = pbVar5 + 1;
      uVar6 = (uint)*pbVar5;
    }
  }
  return uVar6;
}

Assistant:

static int
next_null(hd_context *ctx, hd_stream *stm, size_t max)
{
    struct null_filter *state = stm->state;
    size_t n;

    if (state->remain == 0)
        return EOF;
    hd_seek(ctx, state->chain, state->offset, 0);
    n = hd_available(ctx, state->chain, max);
    if (n > state->remain)
        n = state->remain;
    if (n > sizeof(state->buffer))
        n = sizeof(state->buffer);
    memcpy(state->buffer, state->chain->rp, n);
    stm->rp = state->buffer;
    stm->wp = stm->rp + n;
    if (n == 0)
        return EOF;
    state->chain->rp += n;
    state->remain -= n;
    state->offset += (hd_off_t)n;
    stm->pos += (hd_off_t)n;
    return *stm->rp++;
}